

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_SpawnMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClassActor *type;
  VMValue *pVVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  PClassActor *pPVar7;
  char *pcVar8;
  AActor *dest;
  bool bVar9;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar6 = (AActor *)(param->field_0).field_1.a;
      if (pAVar6 != (AActor *)0x0) {
        if ((pAVar6->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
          (pAVar6->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (pAVar6->super_DThinker).super_DObject.Class;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00430b97;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          dest = (AActor *)param[1].field_0.field_1.a;
          if (dest == (AActor *)0x0) {
            NullParam("\"dest\"");
            dest = (AActor *)param[1].field_0.field_1.a;
          }
          pPVar2 = AActor::RegistrationInfo.MyClass;
          if (dest != (AActor *)0x0) {
            if ((dest->super_DThinker).super_DObject.Class == (PClass *)0x0) {
              iVar3 = (**(dest->super_DThinker).super_DObject._vptr_DObject)(dest);
              (dest->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar3)
              ;
            }
            pPVar4 = (dest->super_DThinker).super_DObject.Class;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar2 && bVar9) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar9 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar2) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar9) {
              pcVar8 = "dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00430bb6;
            }
          }
          if (numparam < 3) {
            pcVar8 = "(paramnum) < numparam";
          }
          else {
            if ((param[2].field_0.field_3.Type == '\x03') &&
               ((param[2].field_0.field_1.atag == 1 || (param[2].field_0.field_1.a == (void *)0x0)))
               ) {
              type = (PClassActor *)param[2].field_0.field_1.a;
              if ((type != (PClassActor *)0x0) &&
                 (pPVar7 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
                do {
                  pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
                  if (pPVar7 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
                } while (pPVar7 != (PClassActor *)0x0);
                if (pPVar7 == (PClassActor *)0x0) {
                  pcVar8 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
                  goto LAB_00430bf4;
                }
              }
              if (numparam == 3) {
                pVVar1 = defaultparam->Array;
                if ((pVVar1[3].field_0.field_3.Type == '\x03') &&
                   ((pVVar5 = pVVar1 + 3, pVVar1[3].field_0.field_1.atag == 1 ||
                    ((pVVar5->field_0).field_1.a == (void *)0x0)))) {
LAB_00430af0:
                  pAVar6 = P_SpawnMissile(pAVar6,dest,type,(AActor *)(pVVar5->field_0).field_1.a);
                  if (numret < 1) {
                    iVar3 = 0;
                  }
                  else {
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                                    ,0x197c,
                                    "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    iVar3 = 1;
                    VMReturn::SetPointer(ret,pAVar6,1);
                  }
                  return iVar3;
                }
                pcVar8 = 
                "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                ;
              }
              else {
                if ((param[3].field_0.field_3.Type == '\x03') &&
                   ((pVVar5 = param + 3, param[3].field_0.field_1.atag == 1 ||
                    ((pVVar5->field_0).field_1.a == (void *)0x0)))) goto LAB_00430af0;
                pcVar8 = 
                "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                ;
              }
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x197b,
                            "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar8 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_00430bf4:
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x197a,
                        "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar8 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_00430bb6:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1979,
                    "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00430b97:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1978,
                "int AF_AActor_SpawnMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	PARAM_OBJECT_DEF(owner, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissile(self, dest, type, owner));
}